

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_platform_sdl2.c
# Opt level: O2

uint32_t FAudio_PlatformGetDeviceDetails(uint32_t index,FAudioDeviceDetails *details)

{
  uint32_t uVar1;
  int iVar2;
  uint uVar3;
  char *src;
  char *src_00;
  long lVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  SDL_AudioSpec spec;
  
  SDL_memset(details,0,0x42c);
  uVar1 = FAudio_PlatformGetDeviceCount();
  if (uVar1 <= index) {
    return 0x88960001;
  }
  details->DeviceID[0] = (short)index + 0x30;
  if (index == 0) {
    details->Role = FAudioGlobalDefaultDevice;
    src_00 = (char *)SDL_getenv("FAUDIO_FORCE_DEFAULT_DEVICEID");
    src = "Default Device";
    if (src_00 != (char *)0x0) {
      FAudio_UTF8_To_UTF16(src_00,(uint16_t *)details,0x200);
    }
  }
  else {
    src = (char *)SDL_GetAudioDeviceName(index - 1,0);
    details->Role = FAudioNotDefaultDevice;
  }
  FAudio_UTF8_To_UTF16(src,(uint16_t *)details->DisplayName,0x200);
  lVar4 = SDL_getenv("SDL_AUDIO_FREQUENCY");
  if (lVar4 == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = SDL_atoi(lVar4);
  }
  lVar4 = SDL_getenv("SDL_AUDIO_CHANNELS");
  iVar7 = iVar2;
  if (lVar4 == 0) {
    uVar5 = 0;
    uVar3 = 0;
    if (index != 0) goto LAB_00119bd4;
  }
  else {
    uVar3 = SDL_atoi(lVar4);
    if (index != 0) {
LAB_00119bd4:
      SDL_GetAudioDeviceSpec(index - 1,0,&spec);
      if (iVar2 < 1) {
        iVar7 = spec.freq;
      }
      if (spec.freq < 1) {
        iVar7 = iVar2;
      }
      uVar5 = uVar3;
      if ((int)uVar3 < 1) {
        uVar5 = (uint)spec.channels;
      }
      if (spec.channels != 0) {
        uVar3 = uVar5;
      }
      goto LAB_00119c6c;
    }
    uVar5 = uVar3;
    if (0 < (int)uVar3) goto LAB_00119c6c;
  }
  uVar3 = uVar5;
  for (iVar8 = 0; uVar1 - 1 != iVar8; iVar8 = iVar8 + 1) {
    SDL_GetAudioDeviceSpec(iVar8,0,&spec);
    iVar6 = iVar7;
    if (iVar2 < 1) {
      iVar6 = spec.freq;
    }
    if (spec.channels < 9 && (int)uVar3 < (int)(uint)spec.channels) {
      iVar7 = iVar6;
      uVar3 = (uint)spec.channels;
    }
  }
LAB_00119c6c:
  iVar2 = 48000;
  if (0 < iVar7) {
    iVar2 = iVar7;
  }
  uVar5 = 2;
  if (0 < (int)uVar3) {
    uVar5 = uVar3;
  }
  WriteWaveFormatExtensible(&details->OutputFormat,uVar5,iVar2,&DATAFORMAT_SUBTYPE_PCM);
  return 0;
}

Assistant:

uint32_t FAudio_PlatformGetDeviceDetails(
	uint32_t index,
	FAudioDeviceDetails *details
) {
	const char *name, *envvar;
	int channels, rate;
	SDL_AudioSpec spec;
	uint32_t devcount, i;

	FAudio_zero(details, sizeof(FAudioDeviceDetails));

	devcount = FAudio_PlatformGetDeviceCount();
	if (index >= devcount)
	{
		return FAUDIO_E_INVALID_CALL;
	}

	details->DeviceID[0] = L'0' + index;
	if (index == 0)
	{
		name = "Default Device";
		details->Role = FAudioGlobalDefaultDevice;

		/* This variable will look like a DSound GUID or WASAPI ID, i.e.
		 * "{0.0.0.00000000}.{FD47D9CC-4218-4135-9CE2-0C195C87405B}"
		 */
		envvar = SDL_getenv("FAUDIO_FORCE_DEFAULT_DEVICEID");
		if (envvar != NULL)
		{
			FAudio_UTF8_To_UTF16(
				envvar,
				(uint16_t*) details->DeviceID,
				sizeof(details->DeviceID)
			);
		}
	}
	else
	{
		name = SDL_GetAudioDeviceName(index - 1, 0);
		details->Role = FAudioNotDefaultDevice;
	}
	FAudio_UTF8_To_UTF16(
		name,
		(uint16_t*) details->DisplayName,
		sizeof(details->DisplayName)
	);

	/* Environment variables take precedence over all possible values */
	envvar = SDL_getenv("SDL_AUDIO_FREQUENCY");
	if (envvar != NULL)
	{
		rate = SDL_atoi(envvar);
	}
	else
	{
		rate = 0;
	}
	envvar = SDL_getenv("SDL_AUDIO_CHANNELS");
	if (envvar != NULL)
	{
		channels = SDL_atoi(envvar);
	}
	else
	{
		channels = 0;
	}

#if SDL_VERSION_ATLEAST(2, 0, 15)
	if (index == 0)
	{
		/* Okay, so go grab something from the liquor cabinet and get
		 * ready, because this loop is a bit of a trip:
		 *
		 * We can't get the spec for the default device, because in
		 * audio land a "default device" is a completely foreign idea,
		 * some APIs support it but in reality you just have to pass
		 * NULL as a driver string and the sound server figures out the
		 * rest. In some psychotic universe the device can even be a
		 * network address. No, seriously.
		 *
		 * So what do we do? Well, at least in my experience shipping
		 * for the PC, the easiest thing to do is assume that the
		 * highest spec in the list is what you should target, even if
		 * it turns out that's not the default at the time you create
		 * your device.
		 *
		 * Consider a laptop that has built-in stereo speakers, but is
		 * connected to a home theater system with 5.1 audio. It may be
		 * the case that the stereo audio is active, but the user may
		 * at some point move audio to 5.1, at which point the server
		 * will simply move the endpoint from underneath us and move our
		 * output stream to the new device. At that point, you _really_
		 * want to already be pushing out 5.1, because if not the user
		 * will be stuck recreating the whole program, which on many
		 * platforms is an instant cert failure. The tradeoff is that
		 * you're potentially downmixing a 5.1 stream to stereo, which
		 * is a bit wasteful, but presumably the hardware can handle it
		 * if they were able to use a 5.1 system to begin with.
		 *
		 * So, we just aim for the highest channel count on the system.
		 * We also do this with sample rate to a lesser degree; we try
		 * to use a single device spec at a time, so it may be that
		 * the sample rate you get isn't the highest from the list if
		 * another device had a higher channel count.
		 *
		 * Lastly, if you set SDL_AUDIO_CHANNELS but not
		 * SDL_AUDIO_FREQUENCY, we don't bother checking for a sample
		 * rate, we fall through to the hardcoded value at the bottom of
		 * this function.
		 *
		 * I'm so tired.
		 *
		 * -flibit
		 */
		if (channels <= 0)
		{
			const uint8_t setRate = (rate <= 0);
			devcount -= 1; /* Subtracting the default index */
			for (i = 0; i < devcount; i += 1)
			{
				SDL_GetAudioDeviceSpec(i, 0, &spec);
				if (	(spec.channels > channels) &&
					(spec.channels <= 8)	)
				{
					channels = spec.channels;
					if (setRate)
					{
						/* May be 0! That's okay! */
						rate = spec.freq;
					}
				}
			}
		}
	}
	else
	{
		SDL_GetAudioDeviceSpec(index - 1, 0, &spec);
		if ((spec.freq > 0) && (rate <= 0))
		{
			rate = spec.freq;
		}
		if ((spec.channels > 0) && (channels <= 0))
		{
			channels = spec.channels;
		}
	}
#endif /* SDL >= 2.0.15 */

	/* If we make it all the way here with no format, hardcode a sane one */
	if (rate <= 0)
	{
		rate = 48000;
	}
	if (channels <= 0)
	{
		channels = 2;
	}

	/* Write the format, finally. */
	WriteWaveFormatExtensible(
		&details->OutputFormat,
		channels,
		rate,
		&DATAFORMAT_SUBTYPE_PCM
	);
	return 0;
}